

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O0

void do_mset(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  short sVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  CHAR_DATA *pCVar6;
  CHAR_DATA *this;
  CClass *pCVar7;
  char *pcVar8;
  const_reference pvVar9;
  char *pcVar10;
  CProficiencies *pCVar11;
  char *in_RSI;
  int ind;
  char buf4 [4608];
  int race;
  char buf_1 [4608];
  int sclass;
  AFFECT_DATA af;
  int i;
  int value;
  CHAR_DATA *victim;
  char buf [300];
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  undefined4 in_stack_ffffffffffffa378;
  int in_stack_ffffffffffffa37c;
  CHAR_DATA *in_stack_ffffffffffffa380;
  CHAR_DATA *in_stack_ffffffffffffa388;
  char *in_stack_ffffffffffffa390;
  undefined4 in_stack_ffffffffffffa3a0;
  undefined4 in_stack_ffffffffffffa3a4;
  char *in_stack_ffffffffffffa3a8;
  char *in_stack_ffffffffffffa3b0;
  char *local_5c48;
  int local_5be0;
  char local_49c8 [4424];
  char *in_stack_ffffffffffffc780;
  CHAR_DATA *in_stack_ffffffffffffc788;
  int local_37c4;
  int local_3758;
  CHAR_DATA local_3748 [5];
  char local_2418 [4608];
  char local_1218;
  char *in_stack_ffffffffffffffe8;
  
  smash_tilde(in_RSI);
  one_argument((char *)in_stack_ffffffffffffa380,
               (char *)CONCAT44(in_stack_ffffffffffffa37c,in_stack_ffffffffffffa378));
  pCVar6 = (CHAR_DATA *)
           one_argument((char *)in_stack_ffffffffffffa380,
                        (char *)CONCAT44(in_stack_ffffffffffffa37c,in_stack_ffffffffffffa378));
  strcpy((char *)&local_3748[0].group,(char *)pCVar6);
  if (((local_1218 == '\0') || (local_2418[0] == '\0')) || ((char)local_3748[0].group == '\0')) {
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
  }
  else {
    this = get_char_world(in_stack_ffffffffffffc788,in_stack_ffffffffffffc780);
    if (this == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
    }
    else {
      this->zone = (AREA_DATA_conflict *)0x0;
      bVar1 = is_number((char *)CONCAT44(in_stack_ffffffffffffa37c,in_stack_ffffffffffffa378));
      if (bVar1) {
        local_5be0 = atoi((char *)&local_3748[0].group);
      }
      else {
        local_5be0 = -1;
      }
      bVar1 = str_cmp(local_2418,"aggressor");
      if (bVar1) {
        bVar1 = str_cmp(local_2418,"beauty");
        sVar2 = (short)local_5be0;
        if (bVar1) {
          bVar1 = str_cmp(local_2418,"size");
          if (bVar1) {
            bVar1 = str_cmp(local_2418,"xptotal");
            if (bVar1) {
              bVar1 = str_cmp(local_2418,"home");
              if (bVar1) {
                bVar1 = str_cmp(local_2418,"sp");
                if (bVar1) {
                  bVar1 = str_cmp(local_2418,"str");
                  if (bVar1) {
                    bVar1 = str_cmp(local_2418,"security");
                    if (bVar1) {
                      bVar1 = str_cmp(local_2418,"int");
                      if (bVar1) {
                        bVar1 = str_cmp(local_2418,"wis");
                        if (bVar1) {
                          bVar1 = str_cmp(local_2418,"dex");
                          if (bVar1) {
                            bVar1 = str_cmp(local_2418,"con");
                            if (bVar1) {
                              bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                 (char *)CONCAT44(in_stack_ffffffffffffa3a4,
                                                                  in_stack_ffffffffffffa3a0));
                              if (bVar1) {
                                bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                   (char *)CONCAT44(in_stack_ffffffffffffa3a4,
                                                                    in_stack_ffffffffffffa3a0));
                                if (bVar1) {
                                  bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                     (char *)CONCAT44(in_stack_ffffffffffffa3a4,
                                                                      in_stack_ffffffffffffa3a0));
                                  if (bVar1) {
                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                       (char *)CONCAT44(in_stack_ffffffffffffa3a4,
                                                                        in_stack_ffffffffffffa3a0));
                                    if (bVar1) {
                                      bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                         (char *)CONCAT44(in_stack_ffffffffffffa3a4,
                                                                          in_stack_ffffffffffffa3a0)
                                                        );
                                      if (bVar1) {
                                        bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                           (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                        if (bVar1) {
                                          bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                             (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                          if (bVar1) {
                                            bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                               (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                            if (bVar1) {
                                              bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                 (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                              if (bVar1) {
                                                bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                   (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                if (bVar1) {
                                                  bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                     (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if ((bVar1) ||
                                                     (iVar3 = get_trust((CHAR_DATA *)
                                                                        CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378)), iVar3 < 0x3b)) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    bVar1 = str_prefix(in_stack_ffffffffffffa3a8,
                                                                       (char *)CONCAT44(
                                                  in_stack_ffffffffffffa3a4,
                                                  in_stack_ffffffffffffa3a0));
                                                  if (bVar1) {
                                                    do_mset(pCVar6,in_stack_ffffffffffffffe8);
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if ((bVar1) ||
                                                     (bVar1 = is_number((char *)CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378)), !bVar1)) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    pCVar11 = char_data::Profs(this);
                                                    iVar3 = atoi((char *)&local_3748[0].group);
                                                    CProficiencies::SetPoints(pCVar11,iVar3);
                                                    pCVar6 = local_3748;
                                                    pcVar8 = this->name;
                                                    pCVar11 = char_data::Profs(this);
                                                    uVar4 = CProficiencies::GetPoints(pCVar11);
                                                    sprintf((char *)pCVar6,
                                                            "%s now has %d proficiency points.\n\r",
                                                            pcVar8,(ulong)uVar4);
                                                    send_to_char(pcVar8,pCVar6);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    pcVar8 = one_argument((char *)
                                                  in_stack_ffffffffffffa380,
                                                  (char *)CONCAT44(in_stack_ffffffffffffa37c,
                                                                   in_stack_ffffffffffffa378));
                                                  sVar2 = CProficiencies::ProfIndexLookup
                                                                    ((char *)
                                                  in_stack_ffffffffffffa388);
                                                  iVar3 = (int)sVar2;
                                                  bVar1 = is_npc((CHAR_DATA *)
                                                                 CONCAT44(in_stack_ffffffffffffa37c,
                                                                          in_stack_ffffffffffffa378)
                                                                );
                                                  if (bVar1) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else if ((((iVar3 < 0) ||
                                                            (bVar1 = is_number((char *)CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378)), !bVar1)) ||
                                                  (iVar5 = atoi(pcVar8), 10 < iVar5)) ||
                                                  (iVar5 = atoi(pcVar8), iVar5 < -1)) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    pCVar11 = char_data::Profs(this);
                                                    atoi(pcVar8);
                                                    CProficiencies::SetProf
                                                              ((CProficiencies *)
                                                               CONCAT44(iVar3,
                                                  in_stack_ffffffffffffa3a0),
                                                  (int)((ulong)pCVar11 >> 0x20),(int)pCVar11);
                                                  send_to_char(in_stack_ffffffffffffa390,
                                                               in_stack_ffffffffffffa388);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    bVar1 = is_number((char *)CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    iVar3 = atoi((char *)&local_3748[0].group);
                                                    this->pause = (short)iVar3;
                                                    sprintf((char *)local_3748,
                                                            "%s\'s pause set to %d.\n\r",
                                                            this->true_name,
                                                            (ulong)(uint)(int)this->pause);
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if ((bVar1) ||
                                                     (bVar1 = is_number((char *)CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378)), !bVar1)) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    iVar3 = atoi((char *)&local_3748[0].group);
                                                    this->pcdata->special = (short)iVar3;
                                                    sprintf((char *)local_3748,
                                                            "%s now has %d specializations.\n\r",
                                                            this->name,
                                                            (ulong)(uint)(int)this->pcdata->special)
                                                    ;
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    local_3758 = 0;
                                                    while ((tribe_table[local_3758].name !=
                                                            (char *)0x0 &&
                                                           (bVar1 = str_prefix(
                                                  in_stack_ffffffffffffa3a8,
                                                  (char *)CONCAT44(in_stack_ffffffffffffa3a4,
                                                                   in_stack_ffffffffffffa3a0)),
                                                  bVar1))) {
                                                    local_3758 = local_3758 + 1;
                                                  }
                                                  if (tribe_table[local_3758].name == (char *)0x0) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    this->pcdata->tribe = (short)local_3758;
                                                    pCVar6 = local_3748;
                                                    pcVar8 = this->name;
                                                    pcVar10 = capitalize(tribe_table[local_3758].
                                                                         name);
                                                    sprintf((char *)pCVar6,
                                                            "%s is now in the %s tribe.\n\r",pcVar8,
                                                            pcVar10);
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = is_number((char *)CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    iVar3 = atoi((char *)&local_3748[0].group);
                                                    this->dam_mod = (float)iVar3;
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    local_5c48 = this->short_descr;
                                                  }
                                                  else {
                                                    local_5c48 = this->name;
                                                  }
                                                  sprintf((char *)local_3748,
                                                          "%s\'s dam_mod set to %f%%.\n\r",
                                                          (double)this->dam_mod,local_5c48);
                                                  send_to_char(in_stack_ffffffffffffa390,
                                                               in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    this->group = sVar2;
                                                  }
                                                  else {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    iVar3 = race_lookup(in_stack_ffffffffffffa3b0);
                                                    if (iVar3 == 0) {
                                                      send_to_char(in_stack_ffffffffffffa390,
                                                                   in_stack_ffffffffffffa388);
                                                    }
                                                    else {
                                                      bVar1 = is_npc((CHAR_DATA *)
                                                                     CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if ((bVar1) ||
                                                     (pvVar9 = std::
                                                  vector<race_type,_std::allocator<race_type>_>::
                                                  operator[](&race_table,(long)iVar3),
                                                  (pvVar9->pc_race & 1U) != 0)) {
                                                    this->race = (short)iVar3;
                                                    this->size = pc_race_table[iVar3].size;
                                                  }
                                                  else {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else if ((local_5be0 < -1) || (100 < local_5be0))
                                                  {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    this->pcdata->condition[3] = sVar2;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else if ((local_5be0 < -1) || (100 < local_5be0))
                                                  {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    this->pcdata->condition[0] = sVar2;
                                                  }
                                                  }
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (bVar1) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else if ((local_5be0 < -1) || (100 < local_5be0))
                                                  {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    this->pcdata->condition[2] = sVar2;
                                                  }
                                                  }
                                                  }
                                                  else if ((local_5be0 < -1000) ||
                                                          (1000 < local_5be0)) {
                                                    send_to_char(in_stack_ffffffffffffa390,
                                                                 in_stack_ffffffffffffa388);
                                                  }
                                                  else {
                                                    bVar1 = is_npc((CHAR_DATA *)
                                                                   CONCAT44(
                                                  in_stack_ffffffffffffa37c,
                                                  in_stack_ffffffffffffa378));
                                                  if (!bVar1) {
                                                    this->pcdata->ethos = sVar2;
                                                  }
                                                  }
                                                }
                                                else if ((local_5be0 < -1000) || (1000 < local_5be0)
                                                        ) {
                                                  send_to_char(in_stack_ffffffffffffa390,
                                                               in_stack_ffffffffffffa388);
                                                }
                                                else {
                                                  this->alignment = sVar2;
                                                }
                                              }
                                              else if ((local_5be0 < 0) || (0x32 < local_5be0)) {
                                                send_to_char(in_stack_ffffffffffffa390,
                                                             in_stack_ffffffffffffa388);
                                              }
                                              else {
                                                this->train = sVar2;
                                              }
                                            }
                                            else if ((local_5be0 < 0) || (0xfa < local_5be0)) {
                                              send_to_char(in_stack_ffffffffffffa390,
                                                           in_stack_ffffffffffffa388);
                                            }
                                            else {
                                              this->practice = sVar2;
                                            }
                                          }
                                          else if ((local_5be0 < 0) || (30000 < local_5be0)) {
                                            send_to_char(in_stack_ffffffffffffa390,
                                                         in_stack_ffffffffffffa388);
                                          }
                                          else {
                                            this->max_move = sVar2;
                                            bVar1 = is_npc((CHAR_DATA *)
                                                           CONCAT44(in_stack_ffffffffffffa37c,
                                                                    in_stack_ffffffffffffa378));
                                            if (!bVar1) {
                                              this->pcdata->perm_move = sVar2;
                                            }
                                          }
                                        }
                                        else if ((local_5be0 < 0) || (30000 < local_5be0)) {
                                          send_to_char(in_stack_ffffffffffffa390,
                                                       in_stack_ffffffffffffa388);
                                        }
                                        else {
                                          this->max_mana = sVar2;
                                          bVar1 = is_npc((CHAR_DATA *)
                                                         CONCAT44(in_stack_ffffffffffffa37c,
                                                                  in_stack_ffffffffffffa378));
                                          if (!bVar1) {
                                            this->pcdata->perm_mana = sVar2;
                                          }
                                        }
                                      }
                                      else if ((local_5be0 < -10) || (30000 < local_5be0)) {
                                        send_to_char(in_stack_ffffffffffffa390,
                                                     in_stack_ffffffffffffa388);
                                      }
                                      else {
                                        this->max_hit = sVar2;
                                        bVar1 = is_npc((CHAR_DATA *)
                                                       CONCAT44(in_stack_ffffffffffffa37c,
                                                                in_stack_ffffffffffffa378));
                                        if (!bVar1) {
                                          this->pcdata->perm_hit = sVar2;
                                        }
                                      }
                                    }
                                    else {
                                      this->gold = (long)local_5be0;
                                    }
                                  }
                                  else {
                                    bVar1 = is_npc((CHAR_DATA *)
                                                   CONCAT44(in_stack_ffffffffffffa37c,
                                                            in_stack_ffffffffffffa378));
                                    if (bVar1) {
                                      if ((local_5be0 < 0) || (0x3c < local_5be0)) {
                                        send_to_char(in_stack_ffffffffffffa390,
                                                     in_stack_ffffffffffffa388);
                                      }
                                      else {
                                        this->level = sVar2;
                                      }
                                    }
                                    else {
                                      send_to_char(in_stack_ffffffffffffa390,
                                                   in_stack_ffffffffffffa388);
                                    }
                                  }
                                }
                                else {
                                  bVar1 = is_npc((CHAR_DATA *)
                                                 CONCAT44(in_stack_ffffffffffffa37c,
                                                          in_stack_ffffffffffffa378));
                                  if (bVar1) {
                                    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388
                                                );
                                  }
                                  else {
                                    iVar3 = CClass::Lookup((char *)in_stack_ffffffffffffa388);
                                    if (iVar3 == -1) {
                                      strcpy(local_49c8,"Possible classes are: ");
                                      for (local_37c4 = 0; local_37c4 < 0xc;
                                          local_37c4 = local_37c4 + 1) {
                                        if (0 < local_37c4) {
                                          strcat(local_49c8," ");
                                        }
                                        pCVar7 = CClass::GetClass(local_37c4);
                                        pcVar8 = RString::operator_cast_to_char_(&pCVar7->name);
                                        strcat(local_49c8,pcVar8);
                                      }
                                      strcat(local_49c8,".\n\r");
                                      send_to_char(in_stack_ffffffffffffa390,
                                                   in_stack_ffffffffffffa388);
                                    }
                                    else {
                                      char_data::SetClass(in_stack_ffffffffffffa380,
                                                          in_stack_ffffffffffffa37c);
                                    }
                                  }
                                }
                              }
                              else if ((local_5be0 < 0) || (2 < local_5be0)) {
                                send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                              }
                              else {
                                this->sex = sVar2;
                                bVar1 = is_npc((CHAR_DATA *)
                                               CONCAT44(in_stack_ffffffffffffa37c,
                                                        in_stack_ffffffffffffa378));
                                if (!bVar1) {
                                  this->pcdata->true_sex = sVar2;
                                }
                              }
                            }
                            else if ((local_5be0 < 3) ||
                                    (iVar3 = get_max_train(in_stack_ffffffffffffa388,
                                                           (int)((ulong)in_stack_ffffffffffffa380 >>
                                                                0x20)), iVar3 < local_5be0)) {
                              uVar4 = get_max_train(in_stack_ffffffffffffa388,
                                                    (int)((ulong)in_stack_ffffffffffffa380 >> 0x20))
                              ;
                              sprintf((char *)local_3748,"Constitution range is 3 to %d.\n\r",
                                      (ulong)uVar4);
                              send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                            }
                            else {
                              this->perm_stat[4] = sVar2;
                            }
                          }
                          else if ((local_5be0 < 3) ||
                                  (iVar3 = get_max_train(in_stack_ffffffffffffa388,
                                                         (int)((ulong)in_stack_ffffffffffffa380 >>
                                                              0x20)), iVar3 < local_5be0)) {
                            uVar4 = get_max_train(in_stack_ffffffffffffa388,
                                                  (int)((ulong)in_stack_ffffffffffffa380 >> 0x20));
                            sprintf((char *)local_3748,"Dexterity ranges is 3 to %d.\n\r",
                                    (ulong)uVar4);
                            send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                          }
                          else {
                            this->perm_stat[3] = sVar2;
                          }
                        }
                        else if ((local_5be0 < 3) ||
                                (iVar3 = get_max_train(in_stack_ffffffffffffa388,
                                                       (int)((ulong)in_stack_ffffffffffffa380 >>
                                                            0x20)), iVar3 < local_5be0)) {
                          uVar4 = get_max_train(in_stack_ffffffffffffa388,
                                                (int)((ulong)in_stack_ffffffffffffa380 >> 0x20));
                          sprintf((char *)local_3748,"Wisdom range is 3 to %d.\n\r",(ulong)uVar4);
                          send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                        }
                        else {
                          this->perm_stat[2] = sVar2;
                        }
                      }
                      else if ((local_5be0 < 3) ||
                              (iVar3 = get_max_train(in_stack_ffffffffffffa388,
                                                     (int)((ulong)in_stack_ffffffffffffa380 >> 0x20)
                                                    ), iVar3 < local_5be0)) {
                        uVar4 = get_max_train(in_stack_ffffffffffffa388,
                                              (int)((ulong)in_stack_ffffffffffffa380 >> 0x20));
                        sprintf((char *)local_3748,"Intelligence range is 3 to %d.\n\r",(ulong)uVar4
                               );
                        send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                      }
                      else {
                        this->perm_stat[1] = sVar2;
                      }
                    }
                    else {
                      bVar1 = is_npc((CHAR_DATA *)
                                     CONCAT44(in_stack_ffffffffffffa37c,in_stack_ffffffffffffa378));
                      if (bVar1) {
                        send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                      }
                      else if ((local_5be0 < 0) || (10 < local_5be0)) {
                        send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                      }
                      else {
                        this->pcdata->security = local_5be0;
                      }
                    }
                  }
                  else if ((local_5be0 < 3) ||
                          (iVar3 = get_max_train(in_stack_ffffffffffffa388,
                                                 (int)((ulong)in_stack_ffffffffffffa380 >> 0x20)),
                          iVar3 < local_5be0)) {
                    uVar4 = get_max_train(in_stack_ffffffffffffa388,
                                          (int)((ulong)in_stack_ffffffffffffa380 >> 0x20));
                    sprintf((char *)local_3748,"Strength range is 3 to %d\n\r.",(ulong)uVar4);
                    send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                  }
                  else {
                    this->perm_stat[0] = sVar2;
                  }
                }
                else if ((local_5be0 < 0) || (20000 < local_5be0)) {
                  send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                }
                else {
                  this->pcdata->sp = sVar2;
                }
              }
              else {
                iVar3 = hometown_lookup((char *)in_stack_ffffffffffffa388);
                if (iVar3 == 0) {
                  send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
                }
                else {
                  iVar3 = hometown_lookup((char *)in_stack_ffffffffffffa388);
                  this->hometown = iVar3;
                }
              }
            }
            else if (local_5be0 < 0) {
              send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
            }
            else {
              this->exp = local_5be0;
            }
          }
          else if ((local_5be0 < 0) || (6 < local_5be0)) {
            send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
          }
          else {
            this->size = sVar2;
          }
        }
        else if ((local_5be0 < 1) || (10 < local_5be0)) {
          send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
        }
        else {
          this->pcdata->beauty = sVar2;
        }
      }
      else {
        init_affect((AFFECT_DATA *)0x5963d1);
        affect_to_char(in_stack_ffffffffffffa380,
                       (AFFECT_DATA *)CONCAT44(in_stack_ffffffffffffa37c,in_stack_ffffffffffffa378))
        ;
        send_to_char(in_stack_ffffffffffffa390,in_stack_ffffffffffffa388);
      }
    }
  }
  return;
}

Assistant:

void do_mset(CHAR_DATA *ch, char *argument)
{
	char arg1[MAX_INPUT_LENGTH];
	char arg2[MAX_INPUT_LENGTH];
	char arg3[MAX_INPUT_LENGTH];
	char buf[300];
	CHAR_DATA *victim;
	int value, i;
	AFFECT_DATA af;

	smash_tilde(argument);
	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	strcpy(arg3, argument);

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0')
	{
		send_to_char("Syntax:\n\r", ch);
		send_to_char("  set char <name> <field> <value>\n\r", ch);
		send_to_char("  Field being one of:\n\r", ch);
		send_to_char("    str int wis dex con sex class level\n\r", ch);
		send_to_char("    race group gold hp mana move prac\n\r", ch);
		send_to_char("    align train thirst hunger drunk home\n\r", ch);
		send_to_char("    xptotal size dam_mod tribe special pause\n\r", ch);
		send_to_char("    beauty security aggressor proficiency profpoints\n\r", ch);
		return;
	}

	victim = get_char_world(ch, arg1);

	if (victim == nullptr)
	{
		send_to_char("They aren't here.\n\r", ch);
		return;
	}

	/* clear zones for mobs */
	victim->zone = nullptr;

	/*
	 * Snarf the value (which need not be numeric).
	 */
	value = is_number(arg3) ? atoi(arg3) : -1;

	/*
	 * Set something.
	 */
	if (!str_cmp(arg2, "aggressor"))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_aggressor;
		af.aftype = AFT_INVIS;
		af.level = 60;
		af.duration = 12;
		affect_to_char(victim, &af);

		send_to_char("Aggressor status set.\n\r", ch);
		return;
	}
	else if (!str_cmp(arg2, "beauty"))
	{
		if (value > 0 && value < 11)
		{
			victim->pcdata->beauty = value;
			return;
		}
		else
		{
			send_to_char("Invalid beauty modifier.\n\r", ch);
			return;
		}
	}

	if (!str_cmp(arg2, "size"))
	{
		if (value > -1 && value <= SIZE_IMMENSE)
		{
			victim->size = value;
			return;
		}

		send_to_char("Invalid size value.\n\r", ch);
		return;
	}

	if (!str_cmp(arg2, "xptotal"))
	{
		if (value < 0)
		{
			send_to_char("Xp total must be greater than 0.\n\r", ch);
			return;
		}

		victim->exp = value;
		return;
	}

	if (!str_cmp(arg2, "home"))
	{
		if (hometown_lookup(arg3))
		{
			victim->hometown = hometown_lookup(arg3);
			return;
		}
		else
		{
			send_to_char("No such hometown.\n\r", ch);
			return;
		}
	}

	if (!str_cmp(arg2, "sp"))
	{
		if (value < 0 || value > 20000)
		{
			send_to_char("Specialization points are between 0 and 20000.\n\r", ch);
			return;
		}

		victim->pcdata->sp = value;
		return;
	}

	if (!str_cmp(arg2, "str"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_STR))
		{
			sprintf(buf, "Strength range is 3 to %d\n\r.", get_max_train(victim, STAT_STR));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_STR] = value;
		return;
	}

	if (!str_cmp(arg2, "security")) /* OLC */
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < 0 || value > 10)
		{
			send_to_char("Valid security is 0-10 only.\n\r", ch);
		}
		else
		{
			victim->pcdata->security = value;
		}

		return;
	}

	if (!str_cmp(arg2, "int"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_INT))
		{
			sprintf(buf, "Intelligence range is 3 to %d.\n\r", get_max_train(victim, STAT_INT));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_INT] = value;
		return;
	}

	if (!str_cmp(arg2, "wis"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_WIS))
		{
			sprintf(buf, "Wisdom range is 3 to %d.\n\r", get_max_train(victim, STAT_WIS));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_WIS] = value;
		return;
	}

	if (!str_cmp(arg2, "dex"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_DEX))
		{
			sprintf(buf, "Dexterity ranges is 3 to %d.\n\r", get_max_train(victim, STAT_DEX));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_DEX] = value;
		return;
	}

	if (!str_cmp(arg2, "con"))
	{
		if (value < 3 || value > get_max_train(victim, STAT_CON))
		{
			sprintf(buf, "Constitution range is 3 to %d.\n\r", get_max_train(victim, STAT_CON));
			send_to_char(buf, ch);
			return;
		}

		victim->perm_stat[STAT_CON] = value;
		return;
	}

	if (!str_prefix(arg2, "sex"))
	{
		if (value < 0 || value > 2)
		{
			send_to_char("Sex range is 0 to 2.\n\r", ch);
			return;
		}

		victim->sex = value;

		if (!is_npc(victim))
			victim->pcdata->true_sex = value;

		return;
	}

	if (!str_prefix(arg2, "class"))
	{
		if (is_npc(victim))
		{
			send_to_char("Mobiles have no class.\n\r", ch);
			return;
		}

		int sclass = CClass::Lookup(arg3);
		if (sclass == -1)
		{
			char buf[MAX_STRING_LENGTH];

			strcpy(buf, "Possible classes are: ");
			for (sclass = 0; sclass < MAX_CLASS; sclass++)
			{
				if (sclass > 0)
					strcat(buf, " ");

				strcat(buf, CClass::GetClass(sclass)->name);
			}

			strcat(buf, ".\n\r");

			send_to_char(buf, ch);
			return;
		}

		victim->SetClass(sclass);
		return;
	}

	if (!str_prefix(arg2, "level"))
	{
		if (!is_npc(victim))
		{
			send_to_char("Not on PC's.\n\r", ch);
			return;
		}

		if (value < 0 || value > 60)
		{
			send_to_char("Level range is 0 to 60.\n\r", ch);
			return;
		}

		victim->level = value;
		return;
	}

	if (!str_prefix(arg2, "gold"))
	{
		victim->gold = value;
		return;
	}

	if (!str_prefix(arg2, "hp"))
	{
		if (value < -10 || value > 30000)
		{
			send_to_char("Hp range is -10 to 30,000 hit points.\n\r", ch);
			return;
		}

		victim->max_hit = value;

		if (!is_npc(victim))
			victim->pcdata->perm_hit = value;

		return;
	}

	if (!str_prefix(arg2, "mana"))
	{
		if (value < 0 || value > 30000)
		{
			send_to_char("mana range is 0 to 30,000 mana points.\n\r", ch);
			return;
		}

		victim->max_mana = value;

		if (!is_npc(victim))
			victim->pcdata->perm_mana = value;

		return;
	}

	if (!str_prefix(arg2, "move"))
	{
		if (value < 0 || value > 30000)
		{
			send_to_char("Move range is 0 to 30,000 move points.\n\r", ch);
			return;
		}

		victim->max_move = value;

		if (!is_npc(victim))
			victim->pcdata->perm_move = value;

		return;
	}

	if (!str_prefix(arg2, "practice"))
	{
		if (value < 0 || value > 250)
		{
			send_to_char("Practice range is 0 to 250 sessions.\n\r", ch);
			return;
		}

		victim->practice = value;
		return;
	}

	if (!str_prefix(arg2, "train"))
	{
		if (value < 0 || value > 50)
		{
			send_to_char("Training session range is 0 to 50 sessions.\n\r", ch);
			return;
		}

		victim->train = value;
		return;
	}

	if (!str_prefix(arg2, "align"))
	{
		if (value < -1000 || value > 1000)
		{
			send_to_char("Alignment range is -1000 to 1000.\n\r", ch);
			return;
		}

		victim->alignment = value;
		return;
	}

	if (!str_prefix(arg2, "ethos"))
	{
		if (value < -1000 || value > 1000)
		{
			send_to_char("Ethos range is -1000 to 1000.\n\r", ch);
			return;
		}

		if (!is_npc(victim))
			victim->pcdata->ethos = value;

		return;
	}

	if (!str_prefix(arg2, "thirst"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Thirst range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_THIRST] = value;
		return;
	}

	if (!str_prefix(arg2, "drunk"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Drunk range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_DRUNK] = value;
		return;
	}

	if (!str_prefix(arg2, "hunger"))
	{
		if (is_npc(victim))
		{
			send_to_char("Not on NPC's.\n\r", ch);
			return;
		}

		if (value < -1 || value > 100)
		{
			send_to_char("Full range is -1 to 100.\n\r", ch);
			return;
		}

		victim->pcdata->condition[COND_HUNGER] = value;
		return;
	}

	if (!str_prefix(arg2, "race"))
	{
		int race = race_lookup(arg3);

		if (race == 0)
		{
			send_to_char("That is not a valid race.\n\r", ch);
			return;
		}

		if (!is_npc(victim) && !race_table[race].pc_race)
		{
			send_to_char("That is not a valid player race.\n\r", ch);
			return;
		}

		victim->race = race;
		victim->size = pc_race_table[race].size;
		return;
	}

	if (!str_prefix(arg2, "group"))
	{
		if (!is_npc(victim))
		{
			send_to_char("Only on NPCs.\n\r", ch);
			return;
		}

		victim->group = value;
		return;
	}

	if (!str_prefix(arg2, "dam_mod"))
	{
		if (!is_number(arg3))
		{
			send_to_char("Invalid dam_mod.\n\r", ch);
			return;
		}

		victim->dam_mod = atoi(arg3);

		sprintf(buf, "%s's dam_mod set to %f%%.\n\r",
			is_npc(victim) ? victim->short_descr : victim->name,
			victim->dam_mod);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "tribe") && get_trust(ch) >= 59)
	{
		for (i = 0; tribe_table[i].name; i++)
		{
			if (!str_prefix(arg3, tribe_table[i].name))
				break;
		}

		if (!tribe_table[i].name)
		{
			send_to_char("There is no tribe by that name.\n\r", ch);
			return;
		}

		victim->pcdata->tribe = i;

		sprintf(buf, "%s is now in the %s tribe.\n\r", victim->name, capitalize(tribe_table[i].name));
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "specializations"))
	{
		if (is_npc(victim) || !is_number(arg3))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		victim->pcdata->special = atoi(arg3);

		sprintf(buf, "%s now has %d specializations.\n\r", victim->name, victim->pcdata->special);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "pause"))
	{
		if (is_npc(victim))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		if (!is_number(arg3))
		{
			send_to_char("Invalid pause.\n\r", ch);
			return;
		}

		victim->pause = atoi(arg3);

		sprintf(buf, "%s's pause set to %d.\n\r", victim->true_name, victim->pause);
		send_to_char(buf, ch);
		return;
	}

	if (!str_prefix(arg2, "proficiency"))
	{
		char buf4[MSL];

		argument = one_argument(argument, buf4);

		int ind = CProficiencies::ProfIndexLookup(buf4);

		if (is_npc(victim))
		{
			send_to_char("Not on mobiles.\n\r", ch);
			return;
		}

		if (ind < 0 || !is_number(argument) || atoi(argument) > 10 || atoi(argument) < -1)
		{
			send_to_char("Invalid input.\n\r", ch);
			return;
		}

		victim->Profs()->SetProf(ind, atoi(argument));

		send_to_char("Proficiency set.\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "profpoints"))
	{
		if (is_npc(victim) || !is_number(arg3))
		{
			send_to_char("You can't do that.\n\r", ch);
			return;
		}

		victim->Profs()->SetPoints(atoi(arg3));

		sprintf(buf, "%s now has %d proficiency points.\n\r", victim->name, victim->Profs()->GetPoints());
		send_to_char(buf, ch);
		return;
	}

	/*
	 * Generate usage message.
	 */
	do_mset(ch, "");
}